

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_graphicsmagick_external
          (CImg<unsigned_char> *this,char *filename)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  CImgArgumentException *this_00;
  char *pcVar6;
  char *pcVar7;
  FILE *pFVar8;
  CImgIOException *this_01;
  char *in_RSI;
  CImg<unsigned_char> *in_RDI;
  FILE *file;
  char filetmp [512];
  char command [1024];
  FILE *in_stack_fffffffffffff8d8;
  CImg<unsigned_char> *in_stack_fffffffffffff8e0;
  undefined8 in_stack_fffffffffffff8e8;
  undefined1 reinit_path;
  char *in_stack_fffffffffffff8f0;
  char local_638 [48];
  char local_438 [855];
  undefined1 in_stack_ffffffffffffff1f;
  char *in_stack_ffffffffffffff20;
  
  if (in_RSI == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    uVar1 = in_RDI->_width;
    uVar2 = in_RDI->_height;
    uVar3 = in_RDI->_depth;
    uVar4 = in_RDI->_spectrum;
    puVar5 = in_RDI->_data;
    pcVar6 = "non-";
    if ((in_RDI->_is_shared & 1U) != 0) {
      pcVar6 = "";
    }
    pcVar7 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_graphicsmagick_external() : Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar6,pcVar7);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  memset(local_438,0,0x400);
  memset(local_638,0,0x200);
  pcVar6 = cimg::graphicsmagick_path
                     (in_stack_fffffffffffff8f0,SUB81((ulong)in_stack_fffffffffffff8e8 >> 0x38,0));
  snprintf(local_438,0x400,"%s convert \"%s\" pnm:-",pcVar6,in_RSI);
  pFVar8 = popen(local_438,"r");
  if (pFVar8 == (FILE *)0x0) {
    do {
      pcVar6 = cimg::temporary_path(in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
      pcVar7 = cimg::filenamerand();
      snprintf(local_638,0x200,"%s%c%s.pnm",pcVar6,0x2f,pcVar7);
      pFVar8 = fopen(local_638,"rb");
      if (pFVar8 != (FILE *)0x0) {
        cimg::fclose(pFVar8);
      }
      reinit_path = (undefined1)((ulong)in_stack_fffffffffffff8e8 >> 0x38);
    } while (pFVar8 != (FILE *)0x0);
    pcVar6 = cimg::graphicsmagick_path(in_stack_fffffffffffff8f0,(bool)reinit_path);
    snprintf(local_438,0x400,"%s convert \"%s\" \"%s\"",pcVar6,in_RSI,local_638);
    cimg::graphicsmagick_path(in_stack_fffffffffffff8f0,(bool)reinit_path);
    cimg::system(local_438);
    pFVar8 = fopen(local_638,"rb");
    if (pFVar8 == (FILE *)0x0) {
      pFVar8 = cimg::fopen(in_RSI,"r");
      cimg::fclose(pFVar8);
      this_01 = (CImgIOException *)__cxa_allocate_exception(0x4008);
      uVar1 = in_RDI->_width;
      uVar2 = in_RDI->_height;
      uVar3 = in_RDI->_depth;
      uVar4 = in_RDI->_spectrum;
      puVar5 = in_RDI->_data;
      pcVar6 = "non-";
      if ((in_RDI->_is_shared & 1U) != 0) {
        pcVar6 = "";
      }
      pcVar7 = pixel_type();
      CImgIOException::CImgIOException
                (this_01,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_graphicsmagick_external() : Failed to load file \'%s\' with external command \'gm\'."
                 ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar6,pcVar7,in_RSI);
      __cxa_throw(this_01,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
    }
    cimg::fclose(pFVar8);
    load_pnm(in_stack_fffffffffffff8e0,(char *)in_stack_fffffffffffff8d8);
    remove(local_638);
  }
  else {
    load_pnm(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
    pclose(pFVar8);
  }
  return in_RDI;
}

Assistant:

CImg<T>& load_graphicsmagick_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_graphicsmagick_external() : Specified filename is (null).",
                                    cimg_instance);

      char command[1024] = { 0 }, filetmp[512] = { 0 };
      std::FILE *file = 0;
#if cimg_OS==1
      cimg_snprintf(command,sizeof(command),"%s convert \"%s\" pnm:-",cimg::graphicsmagick_path(),filename);
      file = popen(command,"r");
      if (file) {
        try { load_pnm(file); } catch (...) {
          pclose(file);
          throw CImgIOException(_cimg_instance
                                "load_graphicsmagick_external() : Failed to load file '%s' with external command 'gm'.",
                                cimg_instance,
                                filename);
        }
        pclose(file);
        return *this;
      }
#endif
      do {
        cimg_snprintf(filetmp,sizeof(filetmp),"%s%c%s.pnm",cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        if ((file=std::fopen(filetmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,sizeof(command),"%s convert \"%s\" \"%s\"",cimg::graphicsmagick_path(),filename,filetmp);
      cimg::system(command,cimg::graphicsmagick_path());
      if (!(file = std::fopen(filetmp,"rb"))) {
        cimg::fclose(cimg::fopen(filename,"r"));
        throw CImgIOException(_cimg_instance
                              "load_graphicsmagick_external() : Failed to load file '%s' with external command 'gm'.",
                              cimg_instance,
                              filename);

      } else cimg::fclose(file);
      load_pnm(filetmp);
      std::remove(filetmp);
      return *this;
    }